

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

hostbuf_wrap * __thiscall
clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
          (clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *this)

{
  int iVar1;
  hostbuf_wrap *value;
  
  if (_routine_init_hostbuf_wrap == '\0') {
    pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
    _routine_init_hostbuf_wrap = '\x01';
  }
  value = (hostbuf_wrap *)co_getspecific(_routine_key_hostbuf_wrap);
  if (value == (hostbuf_wrap *)0x0) {
    value = (hostbuf_wrap *)calloc(1,0x38);
    iVar1 = co_setspecific(_routine_key_hostbuf_wrap,value);
    if ((value != (hostbuf_wrap *)0x0) && (iVar1 != 0)) {
      free(value);
      value = (hostbuf_wrap *)0x0;
    }
  }
  return value;
}

Assistant:

struct hostent *co_gethostbyname(const char *name)
{
	if (!name)
	{
		return NULL;
	}

	if (__co_hostbuf_wrap->buffer && __co_hostbuf_wrap->iBufferSize > 1024)
	{
		free(__co_hostbuf_wrap->buffer);
		__co_hostbuf_wrap->buffer = NULL;
	}
	if (!__co_hostbuf_wrap->buffer)
	{
		__co_hostbuf_wrap->buffer = (char*)malloc(1024);
		__co_hostbuf_wrap->iBufferSize = 1024;
	}

	struct hostent *host = &__co_hostbuf_wrap->host;
	struct hostent *result = NULL;
	int *h_errnop = &(__co_hostbuf_wrap->host_errno);

	int ret = -1;
	while (ret = gethostbyname_r(name, host, __co_hostbuf_wrap->buffer, 
				__co_hostbuf_wrap->iBufferSize, &result, h_errnop) == ERANGE && 
				*h_errnop == NETDB_INTERNAL )
	{
		free(__co_hostbuf_wrap->buffer);
		__co_hostbuf_wrap->iBufferSize = __co_hostbuf_wrap->iBufferSize * 2;
		__co_hostbuf_wrap->buffer = (char*)malloc(__co_hostbuf_wrap->iBufferSize);
	}

	if (ret == 0 && (host == result)) 
	{
		return host;
	}
	return NULL;
}